

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

char * ngx_conf_set_path_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  ngx_path_t **slot_00;
  ngx_path_t *name;
  ngx_int_t nVar2;
  size_t sVar3;
  ngx_path_t **slot;
  ngx_path_t *path;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_str_t *value;
  ssize_t level;
  char *p;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  slot_00 = (ngx_path_t **)((long)conf + cmd->offset);
  if (*slot_00 == (ngx_path_t *)0x0) {
    name = (ngx_path_t *)ngx_pcalloc(cf->pool,0x60);
    if (name == (ngx_path_t *)0x0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      pvVar1 = cf->args->elts;
      (name->name).len = *(size_t *)((long)pvVar1 + 0x10);
      (name->name).data = *(u_char **)((long)pvVar1 + 0x18);
      if ((name->name).data[(name->name).len - 1] == '/') {
        (name->name).len = (name->name).len - 1;
      }
      nVar2 = ngx_conf_full_name(cf->cycle,(ngx_str_t *)name,0);
      if (nVar2 == 0) {
        name->conf_file = (cf->conf_file->file).name.data;
        name->line = cf->conf_file->line;
        n = 0;
        for (path = (ngx_path_t *)0x2; path < (ngx_path_t *)cf->args->nelts;
            path = (ngx_path_t *)((long)&(path->name).len + 1)) {
          sVar3 = ngx_atoi(*(u_char **)((long)pvVar1 + (long)path * 0x10 + 8),
                           *(size_t *)((long)pvVar1 + (long)path * 0x10));
          if ((sVar3 == 0xffffffffffffffff) || (sVar3 == 0)) {
            return "invalid value";
          }
          name->level[n] = sVar3;
          name->len = sVar3 + 1 + name->len;
          n = n + 1;
        }
        if (n + 10 < name->len) {
          cf_local = (ngx_conf_t *)anon_var_dwarf_1259;
        }
        else {
          *slot_00 = name;
          nVar2 = ngx_add_path(cf,slot_00);
          if (nVar2 == -1) {
            cf_local = (ngx_conf_t *)0xffffffffffffffff;
          }
          else {
            cf_local = (ngx_conf_t *)0x0;
          }
        }
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

char *
ngx_conf_set_path_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ssize_t      level;
    ngx_str_t   *value;
    ngx_uint_t   i, n;
    ngx_path_t  *path, **slot;

    slot = (ngx_path_t **) (p + cmd->offset);

    if (*slot) {
        return "is duplicate";
    }

    path = ngx_pcalloc(cf->pool, sizeof(ngx_path_t));
    if (path == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    path->name = value[1];

    if (path->name.data[path->name.len - 1] == '/') {
        path->name.len--;
    }

    if (ngx_conf_full_name(cf->cycle, &path->name, 0) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    path->conf_file = cf->conf_file->file.name.data;
    path->line = cf->conf_file->line;

    for (i = 0, n = 2; n < cf->args->nelts; i++, n++) {
        level = ngx_atoi(value[n].data, value[n].len);
        if (level == NGX_ERROR || level == 0) {
            return "invalid value";
        }

        path->level[i] = level;
        path->len += level + 1;
    }

    if (path->len > 10 + i) {
        return "invalid value";
    }

    *slot = path;

    if (ngx_add_path(cf, slot) == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}